

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O1

void lws_sul_http_ah_lifecheck(lws_sorted_usec_list_t *sul)

{
  lws *wsi;
  int iVar1;
  time_t tVar2;
  char **ppcVar3;
  ulong uVar4;
  char *pcVar5;
  lws_sorted_usec_list_t *plVar6;
  char buf [256];
  char local_138 [255];
  undefined1 local_39;
  
  tVar2 = time((time_t *)0x0);
  plVar6 = (lws_sorted_usec_list_t *)sul[5].list.prev;
  if (plVar6 != (lws_sorted_usec_list_t *)0x0) {
    do {
      if ((((*(char *)((long)&plVar6[0x18].list.prev + 2) != '\0') &&
           (wsi = (lws *)(plVar6->list).next, wsi != (lws *)0x0)) && (plVar6[0x13].us != 0)) &&
         ((wsi->vhost == (lws_vhost *)0x0 ||
          ((long)wsi->vhost->timeout_secs_ah_idle + 0x168 <= tVar2 - plVar6[0x13].us)))) {
        local_138[0] = '\0';
        lws_get_peer_simple(wsi,local_138,0x100);
        _lws_log(4,"ah excessive hold: wsi %p\n  peer address: %s\n  ah pos %lu\n",wsi,local_138,
                 (ulong)*(uint *)((long)&plVar6[0x17].list.next + 4));
        local_138[0] = '\0';
        ppcVar3 = set;
        uVar4 = 0;
        while( true ) {
          if (uVar4 < 0x58) {
            pcVar5 = *ppcVar3;
          }
          else {
            pcVar5 = (char *)0x0;
          }
          if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) break;
          iVar1 = lws_hdr_total_length(wsi,(lws_token_indexes)uVar4);
          if (iVar1 < 0x100 && iVar1 != 0) {
            iVar1 = lws_hdr_copy(wsi,local_138,0x100,(lws_token_indexes)uVar4);
            if (0 < iVar1) {
              local_39 = 0;
              _lws_log(4,"   %s = %s\n",pcVar5,local_138);
            }
          }
          uVar4 = uVar4 + 1;
          ppcVar3 = ppcVar3 + 1;
        }
        lws_header_table_detach(wsi,0);
        __lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"excessive ah");
        plVar6 = sul + 5;
      }
      plVar6 = (lws_sorted_usec_list_t *)(plVar6->list).prev;
    } while (plVar6 != (lws_sorted_usec_list_t *)0x0);
  }
  return;
}

Assistant:

void
lws_sul_http_ah_lifecheck(lws_sorted_usec_list_t *sul)
{
	struct allocated_headers *ah;
	struct lws_context_per_thread *pt = lws_container_of(sul,
			struct lws_context_per_thread, sul_ah_lifecheck);
	struct lws *wsi;
	time_t now;
	int m;

	now = time(NULL);

	lws_pt_lock(pt, __func__);

	ah = pt->http.ah_list;
	while (ah) {
		int len;
		char buf[256];
		const unsigned char *c;

		if (!ah->in_use || !ah->wsi || !ah->assigned ||
		    (ah->wsi->vhost &&
		     (now - ah->assigned) <
		     ah->wsi->vhost->timeout_secs_ah_idle + 360)) {
			ah = ah->next;
			continue;
		}

		/*
		 * a single ah session somehow got held for
		 * an unreasonable amount of time.
		 *
		 * Dump info on the connection...
		 */
		wsi = ah->wsi;
		buf[0] = '\0';
#if !defined(LWS_PLAT_OPTEE)
		lws_get_peer_simple(wsi, buf, sizeof(buf));
#else
		buf[0] = '\0';
#endif
		lwsl_notice("ah excessive hold: wsi %p\n"
			    "  peer address: %s\n"
			    "  ah pos %lu\n",
			    wsi, buf, (unsigned long)ah->pos);
		buf[0] = '\0';
		m = 0;
		do {
			c = lws_token_to_string(m);
			if (!c)
				break;
			if (!(*c))
				break;

			len = lws_hdr_total_length(wsi, m);
			if (!len || len > (int)sizeof(buf) - 1) {
				m++;
				continue;
			}

			if (lws_hdr_copy(wsi, buf, sizeof buf, m) > 0) {
				buf[sizeof(buf) - 1] = '\0';

				lwsl_notice("   %s = %s\n",
					    (const char *)c, buf);
			}
			m++;
		} while (1);

		/* explicitly detach the ah */
		lws_header_table_detach(wsi, 0);

		/* ... and then drop the connection */

		__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					     "excessive ah");

		ah = pt->http.ah_list;
	}

	lws_pt_unlock(pt);
}